

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O1

bool __thiscall ON_Light::GetBBox(ON_Light *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_3dVector *pOVar1;
  ON_3dPoint *x;
  ON_3dVector *v;
  bool bVar2;
  double dVar3;
  ON_3dPointArray points;
  ON_3dPoint local_170;
  double local_158;
  double local_150;
  double *local_148;
  ON_Circle c;
  ON_BoundingBox cbox;
  
  local_148 = boxmax;
  ON_3dPointArray::ON_3dPointArray(&points,0x10);
  switch(this->m_style) {
  case camera_directional_light:
  case world_directional_light:
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,&this->m_location);
    ON_3dPoint::operator+((ON_3dPoint *)&c,&this->m_location,&this->m_direction);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&c);
    break;
  case camera_spot_light:
  case world_spot_light:
    if ((this->m_spot_angle <= 0.0) || (90.0 <= this->m_spot_angle)) {
      ON_3dPoint::operator+((ON_3dPoint *)&c,&this->m_location,&this->m_direction);
      ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&c);
    }
    else {
      pOVar1 = &this->m_direction;
      local_150 = ON_3dVector::Length(pOVar1);
      local_158 = tan((this->m_spot_angle * 3.141592653589793) / 180.0);
      ON_3dPoint::operator+(&local_170,&this->m_location,pOVar1);
      ON_Plane::ON_Plane((ON_Plane *)&cbox,&local_170,pOVar1);
      ON_Circle::ON_Circle(&c,(ON_Plane *)&cbox,local_150 * local_158);
      ON_Plane::~ON_Plane((ON_Plane *)&cbox);
      ON_Circle::BoundingBox(&cbox,&c);
      ON_BoundingBox::GetCorners(&cbox,&points);
      ON_Plane::~ON_Plane(&c.plane);
    }
  case camera_point_light:
  case world_point_light:
    bVar2 = true;
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,&this->m_location);
    goto LAB_004cae3c;
  case ambient_light:
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,&this->m_location);
  default:
    bVar2 = false;
    goto LAB_004cae3c;
  case world_linear_light:
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,&this->m_location);
    ON_3dPoint::operator+((ON_3dPoint *)&c,&this->m_location,&this->m_length);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&c);
    break;
  case world_rectangular_light:
    x = &this->m_location;
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,x);
    pOVar1 = &this->m_length;
    ON_3dPoint::operator+((ON_3dPoint *)&c,x,pOVar1);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&c);
    v = &this->m_width;
    ON_3dPoint::operator+((ON_3dPoint *)&c,x,v);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&c);
    ON_3dPoint::operator+(&cbox.m_min,x,v);
    ON_3dPoint::operator+((ON_3dPoint *)&c,&cbox.m_min,pOVar1);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)&c);
    ON_3dVector::operator+((ON_3dVector *)&local_170,v,pOVar1);
    ON_3dVector::operator*((ON_3dVector *)&cbox,(ON_3dVector *)&local_170,0.5);
    ON_3dPoint::operator+((ON_3dPoint *)&c,x,(ON_3dVector *)&cbox);
    ON_3dPoint::operator+(&cbox.m_min,(ON_3dPoint *)&c,&this->m_direction);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,&cbox.m_min);
    cbox.m_min.z = (this->m_direction).z;
    cbox.m_min.x = (this->m_direction).x;
    cbox.m_min.y = (this->m_direction).y;
    ON_3dVector::Unitize((ON_3dVector *)&cbox);
    ON_3dVector::operator+((ON_3dVector *)&local_170,v,pOVar1);
    dVar3 = ON_3dVector::Length((ON_3dVector *)&local_170);
    ON_3dVector::operator*=((ON_3dVector *)&cbox,dVar3 / 12.0);
    ON_3dPoint::operator+(&local_170,(ON_3dPoint *)&c,(ON_3dVector *)&cbox);
    ON_SimpleArray<ON_3dPoint>::Append(&points.super_ON_SimpleArray<ON_3dPoint>,&local_170);
  }
  bVar2 = true;
LAB_004cae3c:
  if ((bVar2 != false) && (0 < points.super_ON_SimpleArray<ON_3dPoint>.m_count)) {
    bVar2 = ON_GetPointListBoundingBox
                      (3,false,points.super_ON_SimpleArray<ON_3dPoint>.m_count,3,
                       &(points.super_ON_SimpleArray<ON_3dPoint>.m_a)->x,boxmin,local_148,
                       (uint)bGrowBox);
  }
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&points.super_ON_SimpleArray<ON_3dPoint>);
  return bVar2;
}

Assistant:

bool ON_Light::GetBBox( // returns true if successful
       double* boxmin,    // boxmin[dim]
       double* boxmax,    // boxmax[dim]
       bool bGrowBox
       ) const
{
  bool rc = true;
  ON_3dPointArray points(16);

  switch(m_style)
  {
  case ON::camera_directional_light:
  case ON::world_directional_light:
    points.Append(m_location);
    points.Append(m_location+m_direction);
    break;

  case ON::camera_point_light:
  case ON::world_point_light:
    points.Append(m_location);
    break;

  case ON::camera_spot_light:
  case ON::world_spot_light:
    if ( m_spot_angle > 0.0 && m_spot_angle < 90.0 )
    {
      double r = m_direction.Length()*tan(ON_PI*m_spot_angle/180.0);
      ON_Circle c(ON_Plane(m_location+m_direction,m_direction),r);
      ON_BoundingBox cbox = c.BoundingBox();
      cbox.GetCorners( points );
    }
    else
    {
      points.Append(m_location+m_direction);
    }
    points.Append(m_location);
    break;

  case ON::ambient_light:
    points.Append(m_location);
    rc = false;
    break;
  
  case ON::world_linear_light:
    points.Append(m_location);
    points.Append(m_location+m_length);
    break;

  case ON::world_rectangular_light:
    points.Append(m_location);
    points.Append(m_location+m_length);
    points.Append(m_location+m_width);
    points.Append(m_location+m_width+m_length);
    {
      // include target and direction marker to avoid display clipping
      ON_3dPoint center(m_location+(m_width+m_length)*0.5);
      points.Append(center+m_direction);
      ON_3dVector marker(m_direction); 
      marker.Unitize();
      marker *= (m_width+m_length).Length()/12.0; // from GetRectangularLightSegments
      points.Append(center+marker);
    }
    break;

  default:
    rc = false;
    break;
  }

  if ( rc && points.Count() > 0 )
  {
     rc = ON_GetPointListBoundingBox( 3, 0, points.Count(), 3, 
                                      (double*)points.Array(), 
                                      boxmin, boxmax, 
                                      bGrowBox?true:false )
        ? true 
        : false;
  }

  return rc;
}